

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O3

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load_data(segment_impl<ELFIO::Elf64_Phdr> *this)

{
  ulong uVar1;
  int iVar2;
  const_iterator __begin2;
  undefined4 extraout_var;
  pointer paVar3;
  ulong uVar4;
  char *pcVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_segment)._vptr_segment[3])();
  if (iVar2 == 0) {
    return true;
  }
  iVar2 = (*(this->super_segment)._vptr_segment[0xd])(this);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return true;
  }
  uVar1 = (this->ph).p_offset;
  uVar8 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  if (this->convertor->need_conversion == false) {
    uVar8 = uVar1;
  }
  paVar3 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar3 == (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010f069:
      iVar2 = (*(this->super_segment)._vptr_segment[0xd])(this);
      uVar4 = CONCAT44(extraout_var_00,iVar2);
      uVar1 = this->stream_size;
      if ((((uVar1 < uVar8) || (uVar1 < uVar4)) || (uVar1 - uVar8 < uVar4)) ||
         (uVar4 == 0xffffffffffffffff)) {
        pcVar9 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
      }
      else {
        pcVar5 = (char *)operator_new__(uVar4 + 1,(nothrow_t *)&std::nothrow);
        pcVar9 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar5;
        if (pcVar9 != (char *)0x0) {
          operator_delete__(pcVar9);
        }
        std::istream::seekg(this->pstream,uVar8,0);
        pcVar9 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if (pcVar9 == (char *)0x0) {
          return false;
        }
        plVar6 = (long *)std::istream::read((char *)this->pstream,(long)pcVar9);
        pcVar9 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
          pcVar9[uVar4] = '\0';
          this->is_loaded = true;
          return true;
        }
      }
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
      if (pcVar9 != (char *)0x0) {
        operator_delete__(pcVar9);
      }
      return false;
    }
    lVar7 = uVar8 - *(long *)paVar3;
    if ((*(long *)paVar3 <= (long)uVar8) && (lVar7 < *(long *)(paVar3 + 0x10))) {
      uVar8 = lVar7 + *(long *)(paVar3 + 0x20);
      goto LAB_0010f069;
    }
    paVar3 = paVar3 + 0x30;
  } while( true );
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }